

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O1

int32_t io_compareRows(void *context,void *left,void *right)

{
  long lVar1;
  int iVar2;
  char *__s1;
  char *__s2;
  char strippedRight [60];
  char strippedLeft [60];
  undefined1 auStack_a8 [64];
  undefined1 local_68 [72];
  
  lVar1 = *context;
  __s1 = (char *)(**(code **)((long)context + 0x18))(local_68,lVar1 + (ulong)*left * 2);
  __s2 = (char *)(**(code **)((long)context + 0x18))(auStack_a8,lVar1 + (ulong)*right * 2);
  iVar2 = strcmp(__s1,__s2);
  return iVar2;
}

Assistant:

static int32_t U_CALLCONV
io_compareRows(const void *context, const void *left, const void *right) {
    char strippedLeft[UCNV_MAX_CONVERTER_NAME_LENGTH],
         strippedRight[UCNV_MAX_CONVERTER_NAME_LENGTH];

    TempAliasTable *tempTable=(TempAliasTable *)context;
    const char *chars=tempTable->chars;

    return (int32_t)uprv_strcmp(tempTable->stripForCompare(strippedLeft, chars+2*((const TempRow *)left)->strIndex),
                                tempTable->stripForCompare(strippedRight, chars+2*((const TempRow *)right)->strIndex));
}